

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O1

void __thiscall
Diligent::QueryManagerVk::QueryManagerVk
          (QueryManagerVk *this,RenderDeviceVkImpl *pRenderDeviceVk,Uint32 *QueryHeapSizes,
          SoftwareQueueIndex CmdQueueInd)

{
  undefined8 *puVar1;
  uint uVar2;
  VulkanPhysicalDevice *pVVar3;
  VulkanLogicalDevice *LogicalDevice;
  float fVar4;
  undefined8 uVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ICommandQueueVk *pIVar9;
  char (*Args_1) [108];
  QUERY_TYPE Type;
  QueryPoolInfo *this_00;
  uint uVar10;
  string msg;
  string local_90;
  uint local_70;
  int local_6c;
  VkQueryPoolCreateInfo local_68;
  RenderDeviceVkImpl *local_40;
  Uint32 *local_38;
  
  (this->m_CommandQueueId).m_Value = CmdQueueInd.m_Value;
  lVar7 = 0x30;
  do {
    puVar1 = (undefined8 *)((long)(this->m_Pools)._M_elems + lVar7 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m_Pools)._M_elems + lVar7 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(this->m_Pools)._M_elems + lVar7 + -0x10) = 0;
    puVar1 = (undefined8 *)((long)(this->m_Pools)._M_elems + lVar7 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->m_Pools)._M_elems[0].m_vkQueryPool.m_pLogicalDevice.
                     super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(this->m_Pools)._M_elems[0].m_Type + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->m_Pools)._M_elems[0].m_QueriesMtx.super___mutex_base._M_mutex + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(this->m_Pools)._M_elems[0].m_QueriesMtx.super___mutex_base._M_mutex +
             lVar7 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)&(this->m_Pools)._M_elems[0].m_QueriesMtx.super___mutex_base._M_mutex + lVar7 + 0x20) =
         0;
    lVar7 = lVar7 + 0x80;
  } while (lVar7 != 0x330);
  this->m_CounterFrequency = 0;
  pVVar3 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  LogicalDevice =
       (pRenderDeviceVk->m_LogicalVkDevice).
       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fVar4 = 1e+09 / (pVVar3->m_Properties).limits.timestampPeriod;
  uVar8 = (ulong)fVar4;
  this->m_CounterFrequency = (long)(fVar4 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
  local_40 = pRenderDeviceVk;
  local_38 = QueryHeapSizes;
  pIVar9 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&pRenderDeviceVk->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CmdQueueInd);
  local_68.sType = (*(pIVar9->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar9);
  bVar6 = StaticCast<unsigned_char,unsigned_int>(&local_68.sType);
  uVar8 = (ulong)bVar6;
  local_70 = (LogicalDevice->m_SupportedStagesMask).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
  lVar7 = *(long *)&(pVVar3->m_QueueFamilyProperties).
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl;
  uVar2 = *(uint *)(lVar7 + uVar8 * 0x18);
  local_6c = *(int *)(lVar7 + 8 + uVar8 * 0x18);
  uVar10 = 0x4ff;
  if ((local_70 & 0x40) == 0) {
    uVar10 = 0x4e7;
  }
  uVar10 = (local_70 & 0x10) << 4 | uVar10;
  this_00 = (this->m_Pools)._M_elems;
  uVar8 = 1;
  do {
    this_00 = this_00 + 1;
    if (((uVar8 != 1) || ((LogicalDevice->m_EnabledFeatures).occlusionQueryPrecise != 0)) &&
       ((uVar8 != 4 || ((LogicalDevice->m_EnabledFeatures).pipelineStatisticsQuery != 0)))) {
      Type = (QUERY_TYPE)uVar8;
      if ((Type == QUERY_TYPE_DURATION) || (Type == QUERY_TYPE_TIMESTAMP)) {
        if ((local_6c != 0) &&
           (((uVar2 & 3) != 0 ||
            ((local_40->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
             TransferQueueTimestampQueries != DEVICE_FEATURE_STATE_DISABLED)))) goto LAB_0022cfa2;
      }
      else if ((uVar2 & 1) != 0) {
LAB_0022cfa2:
        local_68.queryCount = 0;
        local_68.pipelineStatistics = 0;
        local_68.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
        local_68._4_4_ = 0;
        local_68.pNext = (void *)0x0;
        local_68.flags = 0;
        local_68.queryType = VK_QUERY_TYPE_OCCLUSION;
        switch(Type) {
        case QUERY_TYPE_OCCLUSION:
        case QUERY_TYPE_BINARY_OCCLUSION:
          local_68.flags = 0;
          local_68.queryType = VK_QUERY_TYPE_OCCLUSION;
          break;
        case QUERY_TYPE_TIMESTAMP:
        case QUERY_TYPE_DURATION:
          local_68.flags = 0;
          local_68.queryType = VK_QUERY_TYPE_TIMESTAMP;
          break;
        case QUERY_TYPE_PIPELINE_STATISTICS:
          local_68.flags = 0;
          local_68.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
          local_68._24_8_ = (ulong)uVar10 << 0x20;
          uVar5 = local_68._24_8_;
          if ((local_70 & 0x20) != 0) {
            local_68.pipelineStatistics._1_1_ = (undefined1)(uVar10 >> 8);
            local_68._24_5_ = SUB85(uVar5,0);
            local_68._24_8_ =
                 (ulong)CONCAT15(local_68.pipelineStatistics._1_1_,local_68._24_5_) | 0x20000000000;
          }
          break;
        default:
          FormatString<char[22]>(&local_90,(char (*) [22])"Unexpected query type");
          DebugAssertionFailed
                    (local_90._M_dataplus._M_p,"QueryManagerVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                     ,0xf1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        local_68.queryCount = local_38[uVar8] << (uVar8 == 5);
        Args_1 = (char (*) [108])(uVar8 & 0xffffffff);
        QueryPoolInfo::Init(this_00,LogicalDevice,&local_68,Type);
        if ((((this_00->m_vkQueryPool).m_VkObject == (VkQueryPool_T *)0x0) ||
            (this_00->m_QueryCount != local_68.queryCount)) || (uVar8 != this_00->m_Type)) {
          FormatString<char[26],char[108]>
                    (&local_90,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType"
                     ,Args_1);
          DebugAssertionFailed
                    (local_90._M_dataplus._M_p,"QueryManagerVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryManagerVk.cpp"
                     ,0xfa);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    uVar8 = uVar8 + 1;
    if (uVar8 == 6) {
      return;
    }
  } while( true );
}

Assistant:

QueryManagerVk::QueryManagerVk(RenderDeviceVkImpl* pRenderDeviceVk,
                               const Uint32        QueryHeapSizes[],
                               SoftwareQueueIndex  CmdQueueInd) :
    m_CommandQueueId{CmdQueueInd}
{
    const auto& LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();

    auto timestampPeriod = PhysicalDevice.GetProperties().limits.timestampPeriod;
    m_CounterFrequency   = static_cast<Uint64>(1000000000.0 / timestampPeriod);

    const auto  QueueFamilyIndex       = HardwareQueueIndex{pRenderDeviceVk->GetCommandQueue(CmdQueueInd).GetQueueFamilyIndex()};
    const auto& EnabledFeatures        = LogicalDevice.GetEnabledFeatures();
    const auto  StageMask              = LogicalDevice.GetSupportedStagesMask(QueueFamilyIndex);
    const auto  QueueFlags             = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].queueFlags;
    const auto& DeviceInfo             = pRenderDeviceVk->GetDeviceInfo();
    const bool  IsTransferQueue        = (QueueFlags & (VK_QUEUE_COMPUTE_BIT | VK_QUEUE_GRAPHICS_BIT)) == 0;
    const bool  QueueSupportsTimestamp = PhysicalDevice.GetQueueProperties()[QueueFamilyIndex].timestampValidBits > 0;

    for (Uint32 query_type = QUERY_TYPE_UNDEFINED + 1; query_type < QUERY_TYPE_NUM_TYPES; ++query_type)
    {
        const auto QueryType = static_cast<QUERY_TYPE>(query_type);
        if ((QueryType == QUERY_TYPE_OCCLUSION && !EnabledFeatures.occlusionQueryPrecise) ||
            (QueryType == QUERY_TYPE_PIPELINE_STATISTICS && !EnabledFeatures.pipelineStatisticsQuery))
            continue;

        // Time and duration queries are supported in all queues
        if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
        {
            if (!QueueSupportsTimestamp)
                continue;

            if (IsTransferQueue && !DeviceInfo.Features.TransferQueueTimestampQueries)
                continue; // Not supported in transfer queue
        }
        // Other queries are supported only in graphics queue
        else if ((QueueFlags & VK_QUEUE_GRAPHICS_BIT) == 0)
            continue;


        // clang-format off
        static_assert(QUERY_TYPE_OCCLUSION          == 1, "Unexpected value of QUERY_TYPE_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_BINARY_OCCLUSION   == 2, "Unexpected value of QUERY_TYPE_BINARY_OCCLUSION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_TIMESTAMP          == 3, "Unexpected value of QUERY_TYPE_TIMESTAMP. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_PIPELINE_STATISTICS== 4, "Unexpected value of QUERY_TYPE_PIPELINE_STATISTICS. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_DURATION           == 5, "Unexpected value of QUERY_TYPE_DURATION. EngineVkCreateInfo::QueryPoolSizes must be updated");
        static_assert(QUERY_TYPE_NUM_TYPES          == 6, "Unexpected value of QUERY_TYPE_NUM_TYPES. EngineVkCreateInfo::QueryPoolSizes must be updated");
        // clang-format on

        VkQueryPoolCreateInfo QueryPoolCI{};
        QueryPoolCI.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
        QueryPoolCI.pNext = nullptr;
        QueryPoolCI.flags = 0;

        static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below");
        switch (QueryType)
        {
            case QUERY_TYPE_OCCLUSION:
            case QUERY_TYPE_BINARY_OCCLUSION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_OCCLUSION;
                break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
                QueryPoolCI.queryType = VK_QUERY_TYPE_TIMESTAMP;
                break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                QueryPoolCI.queryType = VK_QUERY_TYPE_PIPELINE_STATISTICS;
                QueryPoolCI.pipelineStatistics =
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT |
                    VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT;

                if (StageMask & VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT)
                {
                    QueryPoolCI.pipelineStatistics |=
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT |
                        VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT;
                }
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT;
                if (StageMask & VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT)
                    QueryPoolCI.pipelineStatistics |= VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT;
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
        }

        QueryPoolCI.queryCount = QueryHeapSizes[QueryType];
        if (QueryType == QUERY_TYPE_DURATION)
            QueryPoolCI.queryCount *= 2;

        auto& PoolInfo = m_Pools[QueryType];
        PoolInfo.Init(LogicalDevice, QueryPoolCI, QueryType);
        VERIFY_EXPR(!PoolInfo.IsNull() && PoolInfo.GetQueryCount() == QueryPoolCI.queryCount && PoolInfo.GetType() == QueryType);
    }
}